

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

bool __thiscall
Parameter<std::vector<double,std::allocator<double>>>::internalSetData<std::__cxx11::string>
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *data)

{
  byte bVar1;
  bool bVar2;
  string *in_RSI;
  long in_RDI;
  vector<double,_std::allocator<double>_> *in_stack_00000028;
  vector<double,_std::allocator<double>_> *in_stack_00000030;
  bool result;
  vector<double,_std::allocator<double>_> tmp;
  RepType *in_stack_00000078;
  string *in_stack_00000080;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa0;
  string local_50 [39];
  byte local_29;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x242a88);
  std::__cxx11::string::string(local_50,in_RSI);
  bVar2 = ParameterTraits<std::vector<double,_std::allocator<double>_>_>::convert
                    (in_stack_00000080,in_stack_00000078);
  std::__cxx11::string::~string(local_50);
  local_29 = bVar2;
  if (bVar2) {
    *(undefined1 *)(in_RDI + 0x2a) = 0;
    std::vector<double,_std::allocator<double>_>::operator=(in_stack_00000030,in_stack_00000028);
  }
  bVar1 = local_29;
  std::vector<double,_std::allocator<double>_>::~vector(in_stack_ffffffffffffffa0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool internalSetData(T data) {
    ParamType tmp {};
    bool result = ValueType::convert(data, tmp);
    if (result) {
      empty_ = false;
      data_  = tmp;
    }
    return result;
  }